

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O1

void LinkedReadsDatastore::build_from_fastq
               (string *output_filename,string *default_name,string *read1_filename,
               string *read2_filename,LinkedReadsFormat format,uint64_t readsize,size_t chunksize)

{
  pointer *ppbVar1;
  void *pvVar2;
  uint *puVar3;
  byte bVar4;
  uint uVar5;
  _func_int *p_Var6;
  pointer pcVar7;
  pointer pRVar8;
  size_type sVar9;
  bool bVar10;
  undefined8 uVar11;
  pointer pLVar12;
  pointer pvVar13;
  pointer __position;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  char cVar16;
  int i;
  int iVar17;
  uint uVar18;
  ostream *poVar19;
  long lVar20;
  long lVar21;
  size_t sVar22;
  long lVar23;
  long *plVar24;
  ulong uVar25;
  long lVar26;
  long *plVar27;
  int *piVar28;
  char *pcVar29;
  runtime_error *prVar30;
  long *plVar31;
  size_type *psVar32;
  uint64_t uVar33;
  basic_ifstream<char,_std::char_traits<char>_> *c;
  void *pvVar34;
  undefined1 auVar35 [8];
  undefined8 uVar36;
  char cVar37;
  ulong uVar38;
  pointer pbVar39;
  LinkedReadData *r_1;
  uint uVar40;
  LinkedReadData *r;
  undefined1 local_7c8 [8];
  char readbuffer [1000];
  long *local_3d8;
  ofstream output;
  long local_3c8 [2];
  byte abStack_3b8 [216];
  ios_base local_2e0 [264];
  undefined1 auStack_1d8 [8];
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> next_in_chunk;
  undefined1 local_1b0 [8];
  LinkedReadData currrent_read;
  size_type local_150;
  undefined1 auStack_138 [8];
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  reads_in_node;
  undefined1 auStack_108 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> read_tag;
  undefined1 auStack_e8 [8];
  vector<LinkedReadData,_std::allocator<LinkedReadData>_> readdatav;
  uint64_t uStack_c8;
  SDG_FILETYPE type;
  uint64_t readsize_local;
  LinkedTag (*__range2) [951124];
  long local_b0;
  undefined1 auStack_a8 [8];
  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  chunkfiles;
  string __str;
  uint64_t count_3;
  long local_60;
  long lStack_58;
  uint local_50;
  undefined4 uStack_4c;
  uint64_t count;
  undefined8 local_40;
  undefined8 uStack_38;
  
  uVar36 = local_7c8;
  auStack_108 = (undefined1  [8])0x0;
  read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uStack_c8 = readsize;
  poVar19 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"Creating Datastore Index from ",0x1e);
  poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19,(read1_filename->_M_dataplus)._M_p,read1_filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," | ",3);
  poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar19,(read2_filename->_M_dataplus)._M_p,read2_filename->_M_string_length);
  std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  lVar20 = gzopen((read1_filename->_M_dataplus)._M_p,"r");
  if (lVar20 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to open ",0xf);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(read1_filename->_M_dataplus)._M_p,
                         read1_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
    piVar28 = __errno_location();
    pcVar29 = strerror(*piVar28);
    std::operator<<(poVar19,pcVar29);
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
                   "Could not open ",read1_filename);
    std::runtime_error::runtime_error(prVar30,(string *)local_7c8);
    __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar21 = gzopen((read2_filename->_M_dataplus)._M_p,"r");
  if (lVar21 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to open ",0xf);
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(read2_filename->_M_dataplus)._M_p,
                         read2_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
    piVar28 = __errno_location();
    pcVar29 = strerror(*piVar28);
    std::operator<<(poVar19,pcVar29);
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c8,
                   "Could not open ",read2_filename);
    std::runtime_error::runtime_error(prVar30,(string *)local_7c8);
    __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar19 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"Building tag sorted chunks of ",0x1e);
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," pairs",6);
  std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
  std::ostream::put((char)poVar19);
  std::ostream::flush();
  auStack_e8 = (undefined1  [8])0x0;
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0 = lVar21;
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::reserve
            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8,chunksize);
  uVar11 = _setbuf;
  plVar27 = _VTT;
  auStack_a8 = (undefined1  [8])0x0;
  chunkfiles.
  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chunkfiles.
  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_1d8 = (undefined1  [8])0x0;
  next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  currrent_read._0_8_ = &currrent_read.seq1._M_string_length;
  currrent_read.seq1._M_dataplus._M_p = (pointer)0x0;
  currrent_read.seq1._M_string_length._0_1_ = 0;
  currrent_read.seq1.field_2._8_8_ = &currrent_read.seq2._M_string_length;
  currrent_read.seq2._M_dataplus._M_p = (pointer)0x0;
  local_150 = 0;
  currrent_read.seq2._M_string_length._0_1_ = 0;
LAB_0018bb3b:
  while( true ) {
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bb43;
    iVar17 = gzeof();
    if (iVar17 != 0) break;
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bb5e;
    iVar17 = gzeof();
    if (iVar17 != 0) break;
    if (format == raw) goto LAB_0018bbde;
    if (format != UCDavis) goto LAB_0018c042;
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bb8b;
    lVar21 = gzgets(lVar20,local_7c8,999);
    if (lVar21 != 0) {
      lVar21 = 1;
      local_1b0._0_4_ = 0;
      do {
        local_1b0._0_4_ = local_1b0._0_4_ << 2;
        bVar4 = local_7c8[lVar21];
        if (bVar4 < 0x47) {
          if (bVar4 != 0x41) {
            if (bVar4 != 0x43) {
LAB_0018bc63:
              local_1b0._0_4_ = 0;
              break;
            }
            local_1b0._0_4_ = local_1b0._0_4_ | 1;
          }
        }
        else if (bVar4 == 0x47) {
          local_1b0._0_4_ = local_1b0._0_4_ | 2;
        }
        else {
          if (bVar4 != 0x54) goto LAB_0018bc63;
          local_1b0._0_4_ = local_1b0._0_4_ | 3;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x11);
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bc7f;
      lVar21 = gzgets(lVar20,local_7c8,999);
      if (lVar21 != 0) {
        local_3d8 = local_3c8;
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bca8;
        sVar22 = strlen(local_7c8);
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bcbe;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3d8,local_7c8,local_7c8 + sVar22);
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bccd;
        std::__cxx11::string::operator=((string *)&currrent_read,(string *)&local_3d8);
        plVar24 = local_3d8;
        if (local_3d8 != local_3c8) {
          uVar38 = local_3c8[0] + 1;
          *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bcf2;
          operator_delete(plVar24,uVar38);
        }
        if (currrent_read.seq1._M_dataplus._M_p[currrent_read._0_8_ + -1] == '\n') {
          cVar37 = (char)currrent_read.seq1._M_dataplus._M_p;
          *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bd18;
          std::__cxx11::string::resize((ulong)&currrent_read,cVar37 + -1);
        }
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bd2c;
        lVar21 = gzgets(lVar20,local_7c8,999);
        if (lVar21 != 0) {
          *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bd49;
          lVar23 = gzgets(lVar20,local_7c8,999);
          lVar21 = local_b0;
          if (lVar23 != 0) {
            *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bd6a;
            lVar23 = gzgets(lVar21,local_7c8,999);
            lVar21 = local_b0;
            if (lVar23 != 0) {
              *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bd8b;
              lVar21 = gzgets(lVar21,local_7c8,999);
              if (lVar21 != 0) {
                local_3d8 = local_3c8;
                *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bdb4;
                sVar22 = strlen(local_7c8);
                *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bdca;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_3d8,local_7c8,local_7c8 + sVar22);
                *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bdd9;
                std::__cxx11::string::operator=
                          ((string *)(currrent_read.seq1.field_2._M_local_buf + 8),
                           (string *)&local_3d8);
                plVar24 = local_3d8;
                if (local_3d8 != local_3c8) {
                  uVar38 = local_3c8[0] + 1;
                  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bdfe
                  ;
                  operator_delete(plVar24,uVar38);
                }
                if (currrent_read.seq2._M_dataplus._M_p[currrent_read.seq1.field_2._8_8_ + -1] ==
                    '\n') {
                  cVar37 = (char)currrent_read.seq2._M_dataplus._M_p;
                  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18be24
                  ;
                  std::__cxx11::string::resize
                            ((ulong)((long)&currrent_read.seq1.field_2 + 8),cVar37 + -1);
                }
                lVar21 = local_b0;
                *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18be3c;
                lVar23 = gzgets(lVar21,local_7c8,999);
                lVar21 = local_b0;
                if (lVar23 != 0) {
                  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18be5d
                  ;
                  lVar21 = gzgets(lVar21,local_7c8,999);
                  goto LAB_0018c039;
                }
              }
            }
          }
        }
      }
    }
  }
  pLVar12 = readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
            super__Vector_impl_data._M_start;
  auVar35 = auStack_e8;
  if ((long)readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
            super__Vector_impl_data._M_start - (long)auStack_e8 != 0) {
    uVar38 = ((long)readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 3) *
             -0x71c71c71c71c71c7;
    lVar21 = 0x3f;
    if (uVar38 != 0) {
      for (; uVar38 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c777;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar35,pLVar12,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c782;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar35,pLVar12);
    uVar38 = ((long)chunkfiles.
                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
             0xfc0fc0fc0fc0fc1;
    cVar37 = '\x01';
    if (9 < uVar38) {
      uVar25 = uVar38;
      cVar16 = '\x04';
      do {
        cVar37 = cVar16;
        if (uVar25 < 100) {
          cVar37 = cVar37 + -2;
          goto LAB_0018c7fc;
        }
        if (uVar25 < 1000) {
          cVar37 = cVar37 + -1;
          goto LAB_0018c7fc;
        }
        if (uVar25 < 10000) goto LAB_0018c7fc;
        bVar10 = 99999 < uVar25;
        uVar25 = uVar25 / 10000;
        cVar16 = cVar37 + '\x04';
      } while (bVar10);
      cVar37 = cVar37 + '\x01';
    }
LAB_0018c7fc:
    chunkfiles.
    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c813;
    std::__cxx11::string::_M_construct
              ((ulong)&chunkfiles.
                       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,cVar37);
    uVar40 = (uint)__str._M_dataplus._M_p;
    pbVar39 = chunkfiles.
              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c829;
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)pbVar39,uVar40,uVar38);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c842;
    plVar24 = (long *)std::__cxx11::string::replace
                                ((ulong)&chunkfiles.
                                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
                                 (char *)0x0,0x2260b0);
    plVar31 = plVar24 + 2;
    if ((long *)*plVar24 == plVar31) {
      local_60 = *plVar31;
      lStack_58 = plVar24[3];
      __str.field_2._8_8_ = &local_60;
    }
    else {
      local_60 = *plVar31;
      __str.field_2._8_8_ = (long *)*plVar24;
    }
    *plVar24 = (long)plVar31;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c897;
    plVar24 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    psVar32 = (size_type *)(plVar24 + 2);
    if ((size_type *)*plVar24 == psVar32) {
      local_40 = *psVar32;
      uStack_38 = plVar24[3];
      _local_50 = (pointer)&stack0xffffffffffffffc0;
    }
    else {
      local_40 = *psVar32;
      _local_50 = (pointer)*plVar24;
    }
    count = plVar24[1];
    *plVar24 = (long)psVar32;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c8ea;
    std::ofstream::ofstream(&local_3d8,(string *)&stack0xffffffffffffffb0,_S_out);
    _Var15._M_p = _local_50;
    if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
      uVar38 = local_40 + 1;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c8ff;
      operator_delete(_Var15._M_p,uVar38);
    }
    uVar14 = __str.field_2._8_8_;
    if ((long *)__str.field_2._8_8_ != &local_60) {
      uVar38 = local_60 + 1;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c914;
      operator_delete((void *)uVar14,uVar38);
    }
    pbVar39 = chunkfiles.
              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (chunkfiles.
        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
      uVar38 = __str._M_string_length + 1;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c930;
      operator_delete(pbVar39,uVar38);
    }
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c93c;
    poVar19 = sdglib::OutputLog(INFO,true);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c964;
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c97b;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," pairs dumping on chunk ",0x18);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c9a3;
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    p_Var6 = poVar19->_vptr_basic_ostream[-3];
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c9ba;
    std::ios::widen((char)p_Var6 + (char)poVar19);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c9c5;
    std::ostream::put((char)poVar19);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c9cd;
    std::ostream::flush();
    if ((abStack_3b8[local_3d8[-3]] & 5) != 0) {
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18dbb5;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to open ",0xf);
      lVar20 = (long)chunkfiles.
                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18dbe1;
      std::__cxx11::to_string
                ((string *)
                 &chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (lVar20 >> 3) * 0xfc0fc0fc0fc0fc1);
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18dbf8;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&__str.field_2 + 8),"sorted_chunk_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18dc08;
      plVar27 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      _local_50 = (pointer)*plVar27;
      psVar32 = (size_type *)(plVar27 + 2);
      if ((size_type *)_local_50 == psVar32) {
        local_40 = *psVar32;
        uStack_38 = plVar27[3];
        _local_50 = (pointer)&stack0xffffffffffffffc0;
      }
      else {
        local_40 = *psVar32;
      }
      _Var15._M_p = _local_50;
      uVar33 = plVar27[1];
      *plVar27 = (long)psVar32;
      plVar27[1] = 0;
      *(undefined1 *)(plVar27 + 2) = 0;
      count = uVar33;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18df81;
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,_Var15._M_p,uVar33);
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18df98;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18df9d;
      piVar28 = __errno_location();
      iVar17 = *piVar28;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18dfa4;
      pcVar29 = strerror(iVar17);
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18dfaf;
      std::operator<<(poVar19,pcVar29);
      _Var15._M_p = _local_50;
      if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
        uVar38 = local_40 + 1;
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18dfc8;
        operator_delete(_Var15._M_p,uVar38);
      }
      uVar11 = __str.field_2._8_8_;
      if ((long *)__str.field_2._8_8_ != &local_60) {
        uVar38 = local_60 + 1;
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18dfe1;
        operator_delete((void *)uVar11,uVar38);
      }
      pbVar39 = chunkfiles.
                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (chunkfiles.
          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18dffd;
        operator_delete(pbVar39,__str._M_string_length + 1);
      }
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18e007;
      prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
      lVar20 = (long)chunkfiles.
                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18e036;
      std::__cxx11::to_string((string *)auStack_138,(lVar20 >> 3) * 0xfc0fc0fc0fc0fc1);
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18e050;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"sorted_chunk_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_138);
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18e063;
      plVar27 = (long *)std::__cxx11::string::append
                                  ((char *)&chunkfiles.
                                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __str.field_2._8_8_ = *plVar27;
      plVar24 = plVar27 + 2;
      if ((long *)__str.field_2._8_8_ == plVar24) {
        local_60 = *plVar24;
        lStack_58 = plVar27[3];
        __str.field_2._8_8_ = &local_60;
      }
      else {
        local_60 = *plVar24;
      }
      *plVar27 = (long)plVar24;
      plVar27[1] = 0;
      *(undefined1 *)(plVar27 + 2) = 0;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18e2cb;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb0,"Could not open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&__str.field_2 + 8));
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18e2da;
      std::runtime_error::runtime_error(prVar30,(string *)&stack0xffffffffffffffb0);
      *(undefined **)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = &UNK_0018e2f3;
      __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c9f2;
    poVar19 = sdglib::OutputLog(INFO,true);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ca1a;
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ca31;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19," pairs dumping on chunk ",0x18);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ca59;
    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
    p_Var6 = poVar19->_vptr_basic_ostream[-3];
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ca70;
    std::ios::widen((char)p_Var6 + (char)poVar19);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ca7b;
    std::ostream::put((char)poVar19);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ca83;
    std::ostream::flush();
    uVar38 = uStack_c8 * 2 + 0x11 & 0xfffffffffffffff0;
    pvVar34 = (void *)(uVar36 - uVar38);
    __range2 = &(readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                 _M_impl.super__Vector_impl_data._M_start)->tag;
    if (auStack_e8 !=
        (undefined1  [8])
        readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
        super__Vector_impl_data._M_start) {
      readsize_local = uVar36 + (1 - uVar38);
      auVar35 = auStack_e8;
      do {
        *(undefined8 *)((long)pvVar34 + -8) = 0x18caee;
        std::ostream::write((char *)&local_3d8,(long)auVar35);
        uVar25 = uStack_c8;
        lVar21 = uStack_c8 * 2;
        *(undefined8 *)((long)pvVar34 + -8) = 0x18cb0a;
        memset(pvVar34,0,lVar21 + 2);
        pcVar7 = (((pointer)auVar35)->seq1)._M_dataplus._M_p;
        uVar38 = (((pointer)auVar35)->seq1)._M_string_length;
        if (uVar25 <= uVar38) {
          uVar38 = uVar25;
        }
        *(undefined8 *)((long)pvVar34 + -8) = 0x18cb21;
        memcpy(pvVar34,pcVar7,uVar38);
        pvVar2 = (void *)(readsize_local + uVar25);
        pcVar7 = (((pointer)auVar35)->seq2)._M_dataplus._M_p;
        uVar38 = (((pointer)auVar35)->seq2)._M_string_length;
        if (uVar38 < uVar25) {
          uVar25 = uVar38;
        }
        *(undefined8 *)((long)pvVar34 + -8) = 0x18cb43;
        memcpy(pvVar2,pcVar7,uVar25);
        *(undefined8 *)((long)pvVar34 + -8) = 0x18cb51;
        std::ostream::write((char *)&local_3d8,(long)pvVar34);
        auVar35 = (undefined1  [8])((long)auVar35 + 0x48);
      } while (auVar35 != (undefined1  [8])__range2);
    }
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cb6a;
    std::ofstream::close();
    uVar38 = ((long)chunkfiles.
                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
             0xfc0fc0fc0fc0fc1;
    cVar37 = '\x01';
    if (9 < uVar38) {
      uVar25 = uVar38;
      cVar16 = '\x04';
      do {
        cVar37 = cVar16;
        if (uVar25 < 100) {
          cVar37 = cVar37 + -2;
          goto LAB_0018cbe4;
        }
        if (uVar25 < 1000) {
          cVar37 = cVar37 + -1;
          goto LAB_0018cbe4;
        }
        if (uVar25 < 10000) goto LAB_0018cbe4;
        bVar10 = 99999 < uVar25;
        uVar25 = uVar25 / 10000;
        cVar16 = cVar37 + '\x04';
      } while (bVar10);
      cVar37 = cVar37 + '\x01';
    }
LAB_0018cbe4:
    chunkfiles.
    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cbfb;
    std::__cxx11::string::_M_construct
              ((ulong)&chunkfiles.
                       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,cVar37);
    pbVar39 = chunkfiles.
              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cc11;
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)pbVar39,(uint)__str._M_dataplus._M_p,uVar38);
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cc2a;
    plVar24 = (long *)std::__cxx11::string::replace
                                ((ulong)&chunkfiles.
                                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0,
                                 (char *)0x0,0x2260b0);
    plVar31 = plVar24 + 2;
    if ((long *)*plVar24 == plVar31) {
      local_60 = *plVar31;
      lStack_58 = plVar24[3];
      __str.field_2._8_8_ = &local_60;
    }
    else {
      local_60 = *plVar31;
      __str.field_2._8_8_ = (long *)*plVar24;
    }
    *plVar24 = (long)plVar31;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cc7f;
    plVar24 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
    psVar32 = (size_type *)(plVar24 + 2);
    if ((size_type *)*plVar24 == psVar32) {
      local_40 = *psVar32;
      uStack_38 = plVar24[3];
      _local_50 = (pointer)&stack0xffffffffffffffc0;
    }
    else {
      local_40 = *psVar32;
      _local_50 = (pointer)*plVar24;
    }
    count = plVar24[1];
    *plVar24 = (long)psVar32;
    plVar24[1] = 0;
    *(undefined1 *)(plVar24 + 2) = 0;
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cccd;
    std::vector<std::ifstream,std::allocator<std::ifstream>>::emplace_back<std::__cxx11::string>
              ((vector<std::ifstream,std::allocator<std::ifstream>> *)auStack_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffb0);
    _Var15._M_p = _local_50;
    if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
      uVar38 = local_40 + 1;
      *(undefined8 *)((long)pvVar34 + -8) = 0x18cce2;
      operator_delete(_Var15._M_p,uVar38);
    }
    uVar14 = __str.field_2._8_8_;
    if ((long *)__str.field_2._8_8_ != &local_60) {
      uVar38 = local_60 + 1;
      *(undefined8 *)((long)pvVar34 + -8) = 0x18ccf7;
      operator_delete((void *)uVar14,uVar38);
    }
    pbVar39 = chunkfiles.
              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (chunkfiles.
        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
      uVar38 = __str._M_string_length + 1;
      *(undefined8 *)((long)pvVar34 + -8) = 0x18cd13;
      operator_delete(pbVar39,uVar38);
    }
    auVar35 = auStack_e8;
    if (((byte)chunkfiles.
               super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [*(long *)(*(long *)(chunkfiles.
                                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + -0x208) + -0x18) +
                -0x1e8] & 5) != 0) {
      *(undefined8 *)((long)pvVar34 + -8) = 0x18dc4a;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to open ",0xf);
      lVar20 = (long)chunkfiles.
                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
      *(undefined8 *)((long)pvVar34 + -8) = 0x18dc76;
      std::__cxx11::to_string
                ((string *)
                 &chunkfiles.
                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (lVar20 >> 3) * 0xfc0fc0fc0fc0fc1);
      *(undefined8 *)((long)pvVar34 + -8) = 0x18dc8d;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&__str.field_2 + 8),"sorted_chunk_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      *(undefined8 *)((long)pvVar34 + -8) = 0x18dc9d;
      plVar27 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      _local_50 = (pointer)*plVar27;
      psVar32 = (size_type *)(plVar27 + 2);
      if ((size_type *)_local_50 == psVar32) {
        local_40 = *psVar32;
        uStack_38 = plVar27[3];
        _local_50 = (pointer)&stack0xffffffffffffffc0;
      }
      else {
        local_40 = *psVar32;
      }
      _Var15._M_p = _local_50;
      uVar33 = plVar27[1];
      *plVar27 = (long)psVar32;
      plVar27[1] = 0;
      *(undefined1 *)(plVar27 + 2) = 0;
      count = uVar33;
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e0c3;
      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,_Var15._M_p,uVar33);
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e0da;
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e0df;
      piVar28 = __errno_location();
      iVar17 = *piVar28;
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e0e6;
      pcVar29 = strerror(iVar17);
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e0f1;
      std::operator<<(poVar19,pcVar29);
      _Var15._M_p = _local_50;
      if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
        uVar38 = local_40 + 1;
        *(undefined8 *)((long)pvVar34 + -8) = 0x18e10a;
        operator_delete(_Var15._M_p,uVar38);
      }
      uVar36 = __str.field_2._8_8_;
      if ((long *)__str.field_2._8_8_ != &local_60) {
        uVar38 = local_60 + 1;
        *(undefined8 *)((long)pvVar34 + -8) = 0x18e123;
        operator_delete((void *)uVar36,uVar38);
      }
      pbVar39 = chunkfiles.
                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (chunkfiles.
          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
        *(undefined8 *)((long)pvVar34 + -8) = 0x18e13f;
        operator_delete(pbVar39,__str._M_string_length + 1);
      }
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e149;
      prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
      lVar20 = (long)chunkfiles.
                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e178;
      std::__cxx11::to_string((string *)auStack_138,(lVar20 >> 3) * 0xfc0fc0fc0fc0fc1);
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e192;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"sorted_chunk_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_138);
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e1a5;
      plVar27 = (long *)std::__cxx11::string::append
                                  ((char *)&chunkfiles.
                                            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __str.field_2._8_8_ = *plVar27;
      plVar24 = plVar27 + 2;
      if ((long *)__str.field_2._8_8_ == plVar24) {
        local_60 = *plVar24;
        lStack_58 = plVar27[3];
        __str.field_2._8_8_ = &local_60;
      }
      else {
        local_60 = *plVar24;
      }
      *plVar27 = (long)plVar24;
      plVar27[1] = 0;
      *(undefined1 *)(plVar27 + 2) = 0;
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e32b;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb0,"Could not open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&__str.field_2 + 8));
      *(undefined8 *)((long)pvVar34 + -8) = 0x18e33a;
      std::runtime_error::runtime_error(prVar30,(string *)&stack0xffffffffffffffb0);
      *(undefined1 **)((long)pvVar34 + -8) = &LAB_0018e353;
      __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cd42;
    std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::_M_erase_at_end
              ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8,
               (pointer)auVar35);
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cd4e;
    poVar19 = sdglib::OutputLog(INFO,true);
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cd65;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"dumped!",7);
    p_Var6 = poVar19->_vptr_basic_ostream[-3];
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cd79;
    std::ios::widen((char)p_Var6 + (char)poVar19);
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cd84;
    std::ostream::put((char)poVar19);
    *(undefined8 *)((long)pvVar34 + -8) = 0x18cd8c;
    std::ostream::flush();
    local_3d8 = plVar27;
    *(undefined8 *)((long)&local_3d8 + plVar27[-3]) = uVar11;
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cdbd;
    std::filebuf::~filebuf((filebuf *)&output);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cdc9;
    std::ios_base::~ios_base(local_2e0);
  }
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cdd5;
  poVar19 = sdglib::OutputLog(INFO,true);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cdec;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"performing merge from disk",0x1a);
  p_Var6 = poVar19->_vptr_basic_ostream[-3];
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ce00;
  std::ios::widen((char)p_Var6 + (char)poVar19);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ce0b;
  std::ostream::put((char)poVar19);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ce13;
  std::ostream::flush();
  pcVar29 = (output_filename->_M_dataplus)._M_p;
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ce2e;
  std::ofstream::ofstream(&local_3d8,pcVar29,_S_out);
  if ((abStack_3b8[local_3d8[-3]] & 5) != 0) {
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18db04;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Failed to open ",0xf);
    pcVar29 = (output_filename->_M_dataplus)._M_p;
    sVar9 = output_filename->_M_string_length;
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18db1e;
    poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar29,sVar9);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18db35;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18db3a;
    piVar28 = __errno_location();
    iVar17 = *piVar28;
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18db41;
    pcVar29 = strerror(iVar17);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18db4c;
    std::operator<<(poVar19,pcVar29);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18db56;
    prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18db70;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb0,"Could not open ",output_filename);
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18db7f;
    std::runtime_error::runtime_error(prVar30,(string *)&stack0xffffffffffffffb0);
    *(undefined **)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = &UNK_0018db98;
    __cxa_throw(prVar30,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ce5f;
  std::ostream::write((char *)&local_3d8,0x22602c);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ce77;
  std::ostream::write((char *)&local_3d8,0x22602e);
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = 3;
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ce94;
  std::ostream::write((char *)&local_3d8,
                      (long)((long)&readdatav.
                                    super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  _local_50 = (pointer)default_name->_M_string_length;
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ceb7;
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
  pcVar7 = (default_name->_M_dataplus)._M_p;
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18ced1;
  std::ostream::write((char *)&local_3d8,(long)pcVar7);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cee9;
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffff38);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cefc;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_108,local_150);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cf08;
  poVar19 = sdglib::OutputLog(INFO,true);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cf1f;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"leaving space for ",0x12);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cf2e;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cf45;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," read_tag entries",0x11);
  p_Var6 = poVar19->_vptr_basic_ostream[-3];
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cf59;
  std::ios::widen((char)p_Var6 + (char)poVar19);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cf64;
  std::ostream::put((char)poVar19);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cf6c;
  std::ostream::flush();
  _local_50 = (pointer)((long)read_tag.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)auStack_108 >> 2);
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cf96;
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
  auVar35 = auStack_108;
  if (_local_50 != (pointer)0x0) {
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18cfb6;
    std::ostream::write((char *)&local_3d8,(long)auVar35);
  }
  auVar35 = auStack_a8;
  currrent_read.seq2.field_2._8_8_ =
       chunkfiles.
       super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  lVar21 = (long)chunkfiles.
                 super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3;
  __range2 = (LinkedTag (*) [951124])(lVar21 * 0xfc0fc0fc0fc0fc1);
  uVar33 = uVar36 - (lVar21 * 0x3f03f03f03f03f04 + 0xfU & 0xfffffffffffffff0);
  lVar21 = uVar33 - (uStack_c8 * 2 + 0x11 & 0xfffffffffffffff0);
  next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)uVar36;
  readsize_local = uVar33;
  if ((undefined1  [8])
      chunkfiles.
      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_a8) {
    lVar23 = 0;
    uVar38 = 0;
    do {
      pbVar39 = (pointer)((long)auStack_a8 + lVar23);
      *(undefined8 *)(lVar21 + -8) = 0x18d05a;
      std::istream::read((char *)pbVar39,uVar33);
      uVar38 = uVar38 + 1;
      uVar25 = ((long)chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
               0xfc0fc0fc0fc0fc1;
      lVar23 = lVar23 + 0x208;
      uVar33 = uVar33 + 4;
    } while (uVar38 <= uVar25 && uVar25 - uVar38 != 0);
  }
  if ((undefined1  [8])
      read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != auStack_108) {
    read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)auStack_108;
  }
  if ((int)__range2 != 0) {
    lVar23 = (long)__range2 << 2;
    do {
      local_50 = 0xffffffff;
      if ((undefined1  [8])currrent_read.seq2.field_2._8_8_ != auVar35) {
        uVar40 = 0xffffffff;
        lVar26 = 0;
        do {
          uVar5 = *(uint *)(readsize_local + lVar26);
          if (uVar5 < uVar40) {
            local_50 = uVar5;
            uVar40 = uVar5;
          }
          lVar26 = lVar26 + 4;
        } while (lVar23 != lVar26);
      }
      if ((undefined1  [8])
          chunkfiles.
          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != auStack_a8) {
        uVar38 = 0;
        do {
          lVar26 = uVar38 * 0x208;
          pbVar39 = (pointer)((long)auStack_a8 + lVar26);
          if (((byte)pbVar39[*(long *)(*(long *)((long)auStack_a8 + lVar26) + -0x18) + 0x20] & 2) ==
              0) {
            puVar3 = (uint *)(readsize_local + uVar38 * 4);
            do {
              if (*puVar3 != local_50) break;
              *(undefined8 *)(lVar21 + -8) = 0x18d16c;
              std::istream::read((char *)pbVar39,lVar21);
              *(undefined8 *)(lVar21 + -8) = 0x18d18a;
              std::ostream::write((char *)&local_3d8,lVar21);
              __position = read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
              if (read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                *(undefined8 *)(lVar21 + -8) = 0x18d1bc;
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_108,
                           (iterator)__position,&stack0xffffffffffffffb0);
              }
              else {
                *read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start = local_50;
                read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1;
              }
              pbVar39 = (pointer)((long)auStack_a8 + lVar26);
              *(undefined8 *)(lVar21 + -8) = 0x18d1d3;
              std::istream::read((char *)pbVar39,(long)puVar3);
              if (((byte)*(pointer)((long)auStack_a8 +
                                   *(long *)(*(long *)((long)auStack_a8 + lVar26) + -0x18) + 0x20 +
                                   lVar26) & 2) != 0) {
                *puVar3 = 0xffffffff;
                *(undefined8 *)(lVar21 + -8) = 0x18d202;
                poVar19 = sdglib::OutputLog(INFO,true);
                *(undefined8 *)(lVar21 + -8) = 0x18d219;
                std::__ostream_insert<char,std::char_traits<char>>(poVar19,"chunk ",6);
                *(undefined8 *)(lVar21 + -8) = 0x18d224;
                poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)uVar38);
                *(undefined8 *)(lVar21 + -8) = 0x18d23b;
                std::__ostream_insert<char,std::char_traits<char>>(poVar19," finished",9);
                p_Var6 = poVar19->_vptr_basic_ostream[-3];
                *(undefined8 *)(lVar21 + -8) = 0x18d250;
                std::ios::widen((char)p_Var6 + (char)poVar19);
                *(undefined8 *)(lVar21 + -8) = 0x18d25b;
                std::ostream::put((char)poVar19);
                *(undefined8 *)(lVar21 + -8) = 0x18d263;
                std::ostream::flush();
                __range2 = (LinkedTag (*) [951124])(ulong)((int)__range2 - 1);
              }
              pbVar39 = (pointer)((long)auStack_a8 + lVar26);
            } while (((byte)pbVar39[*(long *)(*(long *)((long)auStack_a8 + lVar26) + -0x18) + 0x20]
                     & 2) == 0);
          }
          uVar38 = uVar38 + 1;
          uVar25 = ((long)chunkfiles.
                          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
                   0xfc0fc0fc0fc0fc1;
        } while (uVar38 <= uVar25 && uVar25 - uVar38 != 0);
      }
    } while ((int)__range2 != 0);
  }
  *(undefined8 *)(lVar21 + -8) = 0x18d2ef;
  std::ostream::write((char *)&local_3d8,0x22602c);
  *(undefined8 *)(lVar21 + -8) = 0x18d307;
  std::ostream::write((char *)&local_3d8,0x22602e);
  readdatav.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = 6;
  *(undefined8 *)(lVar21 + -8) = 0x18d324;
  std::ostream::write((char *)&local_3d8,
                      (long)((long)&readdatav.
                                    super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  _local_50 = (pointer)0x0;
  *(undefined8 *)(lVar21 + -8) = 0x18d340;
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
  if (_local_50 != (pointer)0x0) {
    *(undefined8 *)(lVar21 + -8) = 0x18d35b;
    std::ostream::write((char *)&local_3d8,0);
  }
  auStack_138 = (undefined1  [8])0x0;
  reads_in_node.
  super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reads_in_node.
  super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __str.field_2._8_8_ = 0;
  *(undefined8 *)(lVar21 + -8) = 0x18d3a1;
  std::ostream::write((char *)&local_3d8,(long)((long)&__str.field_2 + 8));
  pvVar13 = reads_in_node.
            super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((__str.field_2._8_8_ != 0) &&
     (auStack_138 !=
      (undefined1  [8])
      reads_in_node.
      super__Vector_base<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    auVar35 = auStack_138;
    do {
      _local_50 = (pointer)((long)(((pointer)auVar35)->
                                  super__Vector_base<ReadMapping,_std::allocator<ReadMapping>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(((pointer)auVar35)->
                                  super__Vector_base<ReadMapping,_std::allocator<ReadMapping>_>).
                                  _M_impl.super__Vector_impl_data._M_start >> 5);
      *(undefined8 *)(lVar21 + -8) = 0x18d3e5;
      std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
      if (_local_50 != (pointer)0x0) {
        pRVar8 = (((pointer)auVar35)->super__Vector_base<ReadMapping,_std::allocator<ReadMapping>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(lVar21 + -8) = 0x18d3fd;
        std::ostream::write((char *)&local_3d8,(long)pRVar8);
      }
      auVar35 = (undefined1  [8])((long)auVar35 + 0x18);
    } while (auVar35 != (undefined1  [8])pvVar13);
  }
  sVar9 = default_name->_M_string_length;
  *(undefined8 *)(lVar21 + -8) = 0x18d423;
  std::ostream::seekp(&local_3d8,sVar9 + 0x16,0);
  *(undefined8 *)(lVar21 + -8) = 0x18d42f;
  poVar19 = sdglib::OutputLog(INFO,true);
  *(undefined8 *)(lVar21 + -8) = 0x18d446;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"writing down ",0xd);
  *(undefined8 *)(lVar21 + -8) = 0x18d455;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  *(undefined8 *)(lVar21 + -8) = 0x18d46c;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," read_tag entries",0x11);
  p_Var6 = poVar19->_vptr_basic_ostream[-3];
  *(undefined8 *)(lVar21 + -8) = 0x18d480;
  std::ios::widen((char)p_Var6 + (char)poVar19);
  *(undefined8 *)(lVar21 + -8) = 0x18d48b;
  std::ostream::put((char)poVar19);
  *(undefined8 *)(lVar21 + -8) = 0x18d493;
  std::ostream::flush();
  _local_50 = (pointer)((long)read_tag.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)auStack_108 >> 2);
  *(undefined8 *)(lVar21 + -8) = 0x18d4bd;
  std::ostream::write((char *)&local_3d8,(long)&stack0xffffffffffffffb0);
  auVar35 = auStack_108;
  if (_local_50 != (char *)0x0) {
    *(undefined8 *)(lVar21 + -8) = 0x18d4dd;
    std::ostream::write((char *)&local_3d8,(long)auVar35);
  }
  *(undefined8 *)(lVar21 + -8) = 0x18d4e9;
  std::ofstream::close();
  pbVar39 = chunkfiles.
            super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (auVar35 = auStack_a8; auVar35 != (undefined1  [8])pbVar39;
      auVar35 = (undefined1  [8])((long)auVar35 + 0x208)) {
    *(undefined8 *)(lVar21 + -8) = 0x18d504;
    std::ifstream::close();
  }
  if ((undefined1  [8])
      chunkfiles.
      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != auStack_a8) {
    uVar38 = 0;
    ppbVar1 = &chunkfiles.
               super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      uVar40 = 1;
      if (9 < uVar38) {
        uVar5 = 4;
        uVar25 = uVar38;
        do {
          uVar40 = uVar5;
          uVar18 = (uint)uVar25;
          if (uVar18 < 100) {
            uVar40 = uVar40 - 2;
            goto LAB_0018d581;
          }
          if (uVar18 < 1000) {
            uVar40 = uVar40 - 1;
            goto LAB_0018d581;
          }
          if (uVar18 < 10000) goto LAB_0018d581;
          uVar25 = (uVar25 & 0xffffffff) / 10000;
          uVar5 = uVar40 + 4;
        } while (99999 < uVar18);
        uVar40 = uVar40 + 1;
      }
LAB_0018d581:
      chunkfiles.
      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
      *(undefined8 *)(lVar21 + -8) = 0x18d59c;
      std::__cxx11::string::_M_construct((ulong)ppbVar1,(char)uVar40);
      pbVar39 = chunkfiles.
                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)(lVar21 + -8) = 0x18d5ad;
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)pbVar39,uVar40,(uint)uVar38);
      *(undefined8 *)(lVar21 + -8) = 0x18d5c6;
      plVar24 = (long *)std::__cxx11::string::replace((ulong)ppbVar1,0,(char *)0x0,0x2260b0);
      __str.field_2._8_8_ = &local_60;
      plVar31 = plVar24 + 2;
      if ((long *)*plVar24 == plVar31) {
        local_60 = *plVar31;
        lStack_58 = plVar24[3];
      }
      else {
        local_60 = *plVar31;
        __str.field_2._8_8_ = (long *)*plVar24;
      }
      *plVar24 = (long)plVar31;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      *(undefined8 *)(lVar21 + -8) = 0x18d616;
      plVar24 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
      psVar32 = (size_type *)(plVar24 + 2);
      if ((size_type *)*plVar24 == psVar32) {
        local_40 = *psVar32;
        uStack_38 = plVar24[3];
        _local_50 = (pointer)&stack0xffffffffffffffc0;
      }
      else {
        local_40 = *psVar32;
        _local_50 = (pointer)*plVar24;
      }
      _Var15._M_p = _local_50;
      count = plVar24[1];
      *plVar24 = (long)psVar32;
      plVar24[1] = 0;
      *(undefined1 *)(plVar24 + 2) = 0;
      *(undefined8 *)(lVar21 + -8) = 0x18d661;
      unlink(_Var15._M_p);
      _Var15._M_p = _local_50;
      if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
        uVar25 = local_40 + 1;
        *(undefined8 *)(lVar21 + -8) = 0x18d676;
        operator_delete(_Var15._M_p,uVar25);
      }
      uVar36 = __str.field_2._8_8_;
      if ((long *)__str.field_2._8_8_ != &local_60) {
        uVar25 = local_60 + 1;
        *(undefined8 *)(lVar21 + -8) = 0x18d68f;
        operator_delete((void *)uVar36,uVar25);
      }
      pbVar39 = chunkfiles.
                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (chunkfiles.
          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length) {
        uVar25 = __str._M_string_length + 1;
        *(undefined8 *)(lVar21 + -8) = 0x18d6ab;
        operator_delete(pbVar39,uVar25);
      }
      uVar38 = uVar38 + 1;
      uVar25 = ((long)chunkfiles.
                      super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 3) *
               0xfc0fc0fc0fc0fc1;
    } while (uVar38 <= uVar25 && uVar25 - uVar38 != 0);
  }
  *(undefined8 *)(lVar21 + -8) = 0x18d6e3;
  poVar19 = sdglib::OutputLog(INFO,true);
  *(undefined8 *)(lVar21 + -8) = 0x18d6fa;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19,"Datastore with ",0xf);
  *(undefined8 *)(lVar21 + -8) = 0x18d713;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  *(undefined8 *)(lVar21 + -8) = 0x18d72a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," reads, ",8);
  *(undefined8 *)(lVar21 + -8) = 0x18d739;
  poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
  *(undefined8 *)(lVar21 + -8) = 0x18d750;
  std::__ostream_insert<char,std::char_traits<char>>(poVar19," reads with tags",0x10);
  p_Var6 = poVar19->_vptr_basic_ostream[-3];
  *(undefined8 *)(lVar21 + -8) = 0x18d764;
  std::ios::widen((char)p_Var6 + (char)poVar19);
  *(undefined8 *)(lVar21 + -8) = 0x18d76f;
  std::ostream::put((char)poVar19);
  *(undefined8 *)(lVar21 + -8) = 0x18d777;
  std::ostream::flush();
  *(undefined8 *)(lVar21 + -8) = 0x18d783;
  gzclose(lVar20);
  lVar20 = local_b0;
  *(undefined8 *)(lVar21 + -8) = 0x18d78f;
  gzclose(lVar20);
  *(undefined8 *)(lVar21 + -8) = 0x18d79b;
  std::
  vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
  ::~vector((vector<std::vector<ReadMapping,_std::allocator<ReadMapping>_>,_std::allocator<std::vector<ReadMapping,_std::allocator<ReadMapping>_>_>_>
             *)auStack_138);
  pLVar12 = next_in_chunk.super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_3d8 = plVar27;
  *(undefined8 *)((long)&local_3d8 + plVar27[-3]) = uVar11;
  *(undefined8 *)((long)&pLVar12[-1].seq2.field_2 + 8) = 0x18d7cc;
  std::filebuf::~filebuf((filebuf *)&output);
  *(undefined8 *)((long)&pLVar12[-1].seq2.field_2 + 8) = 0x18d7d8;
  std::ios_base::~ios_base(local_2e0);
  uVar36 = currrent_read.seq1.field_2._8_8_;
  if ((size_type *)currrent_read.seq1.field_2._8_8_ != &currrent_read.seq2._M_string_length) {
    lVar20 = CONCAT71(currrent_read.seq2._M_string_length._1_7_,
                      (undefined1)currrent_read.seq2._M_string_length);
    *(undefined8 *)((long)&pLVar12[-1].seq2.field_2 + 8) = 0x18d7fa;
    operator_delete((void *)uVar36,lVar20 + 1);
  }
  uVar36 = currrent_read._0_8_;
  if ((size_type *)currrent_read._0_8_ != &currrent_read.seq1._M_string_length) {
    lVar20 = CONCAT71(currrent_read.seq1._M_string_length._1_7_,
                      (undefined1)currrent_read.seq1._M_string_length);
    *(undefined8 *)((long)&pLVar12[-1].seq2.field_2 + 8) = 0x18d81c;
    operator_delete((void *)uVar36,lVar20 + 1);
  }
  *(undefined8 *)((long)&pLVar12[-1].seq2.field_2 + 8) = 0x18d828;
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::~vector
            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_1d8);
  *(undefined8 *)((long)&pLVar12[-1].seq2.field_2 + 8) = 0x18d834;
  std::
  vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             *)auStack_a8);
  *(undefined8 *)((long)&pLVar12[-1].seq2.field_2 + 8) = 0x18d840;
  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::~vector
            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8);
  auVar35 = auStack_108;
  if (auStack_108 != (undefined1  [8])0x0) {
    uVar38 = (long)read_tag.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)auStack_108;
    *(undefined8 *)((long)&pLVar12[-1].seq2.field_2 + 8) = 0x18d85b;
    operator_delete((void *)auVar35,uVar38);
  }
  return;
LAB_0018bbde:
  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bbf2;
  lVar21 = gzgets(lVar20,local_7c8,999);
  if (lVar21 != 0) {
    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bc0f;
    lVar21 = gzgets(lVar20,local_7c8,999);
    if (lVar21 != 0) {
      lVar21 = 0;
      local_1b0._0_4_ = 0;
      do {
        local_1b0._0_4_ = local_1b0._0_4_ << 2;
        bVar4 = local_7c8[lVar21];
        if (bVar4 < 0x47) {
          if (bVar4 != 0x41) {
            if (bVar4 != 0x43) {
LAB_0018be62:
              local_1b0._0_4_ = 0;
              break;
            }
            local_1b0._0_4_ = local_1b0._0_4_ | 1;
          }
        }
        else if (bVar4 == 0x47) {
          local_1b0._0_4_ = local_1b0._0_4_ | 2;
        }
        else {
          if (bVar4 != 0x54) goto LAB_0018be62;
          local_1b0._0_4_ = local_1b0._0_4_ | 3;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x10);
      local_3d8 = local_3c8;
      pcVar29 = readbuffer + 0xf;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18be87;
      sVar22 = strlen(pcVar29);
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18be9d;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,pcVar29,pcVar29 + sVar22)
      ;
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18beac;
      std::__cxx11::string::operator=((string *)&currrent_read,(string *)&local_3d8);
      plVar24 = local_3d8;
      if (local_3d8 != local_3c8) {
        uVar38 = local_3c8[0] + 1;
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bece;
        operator_delete(plVar24,uVar38);
      }
      if (currrent_read.seq1._M_dataplus._M_p[currrent_read._0_8_ + -1] == '\n') {
        cVar37 = (char)currrent_read.seq1._M_dataplus._M_p;
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bef4;
        std::__cxx11::string::resize((ulong)&currrent_read,cVar37 + -1);
      }
      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bf08;
      lVar21 = gzgets(lVar20,local_7c8,999);
      if (lVar21 != 0) {
        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bf25;
        lVar23 = gzgets(lVar20,local_7c8,999);
        lVar21 = local_b0;
        if (lVar23 != 0) {
          *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bf46;
          lVar23 = gzgets(lVar21,local_7c8,999);
          lVar21 = local_b0;
          if (lVar23 != 0) {
            *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bf67;
            lVar21 = gzgets(lVar21,local_7c8,999);
            if (lVar21 != 0) {
              local_3d8 = local_3c8;
              *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bf90;
              sVar22 = strlen(local_7c8);
              *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bfa6;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3d8,local_7c8,local_7c8 + sVar22);
              *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bfb5;
              std::__cxx11::string::operator=
                        ((string *)(currrent_read.seq1.field_2._M_local_buf + 8),
                         (string *)&local_3d8);
              plVar24 = local_3d8;
              if (local_3d8 != local_3c8) {
                uVar38 = local_3c8[0] + 1;
                *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18bfda;
                operator_delete(plVar24,uVar38);
              }
              if (currrent_read.seq2._M_dataplus._M_p[currrent_read.seq1.field_2._8_8_ + -1] == '\n'
                 ) {
                cVar37 = (char)currrent_read.seq2._M_dataplus._M_p;
                *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c000;
                std::__cxx11::string::resize
                          ((ulong)((long)&currrent_read.seq1.field_2 + 8),cVar37 + -1);
              }
              lVar21 = local_b0;
              *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c018;
              lVar23 = gzgets(lVar21,local_7c8,999);
              lVar21 = local_b0;
              if (lVar23 != 0) {
                *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c039;
                lVar21 = gzgets(lVar21,local_7c8,999);
LAB_0018c039:
                if (lVar21 != 0) {
LAB_0018c042:
                  *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) = 0x18c06d
                  ;
                  std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::push_back
                            ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8,
                             (value_type *)local_1b0);
                  pLVar12 = readdatav.
                            super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  auVar35 = auStack_e8;
                  local_150 = local_150 + 1;
                  uVar38 = ((long)readdatav.
                                  super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                  ._M_impl.super__Vector_impl_data._M_start - (long)auStack_e8 >> 3)
                           * -0x71c71c71c71c71c7;
                  if (uVar38 - chunksize == 0) {
                    if (auStack_e8 !=
                        (undefined1  [8])
                        readdatav.
                        super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                        super__Vector_impl_data._M_start) {
                      lVar21 = 0x3f;
                      if (uVar38 != 0) {
                        for (; uVar38 >> lVar21 == 0; lVar21 = lVar21 + -1) {
                        }
                      }
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18c0c1;
                      std::
                      __introsort_loop<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                                (auVar35,pLVar12,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18c0cc;
                      std::
                      __final_insertion_sort<__gnu_cxx::__normal_iterator<LinkedReadData*,std::vector<LinkedReadData,std::allocator<LinkedReadData>>>,__gnu_cxx::__ops::_Iter_less_iter>
                                (auVar35,pLVar12);
                    }
                    uVar38 = ((long)chunkfiles.
                                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >>
                             3) * 0xfc0fc0fc0fc0fc1;
                    cVar37 = '\x01';
                    if (9 < uVar38) {
                      uVar25 = uVar38;
                      cVar16 = '\x04';
                      do {
                        cVar37 = cVar16;
                        if (uVar25 < 100) {
                          cVar37 = cVar37 + -2;
                          goto LAB_0018c146;
                        }
                        if (uVar25 < 1000) {
                          cVar37 = cVar37 + -1;
                          goto LAB_0018c146;
                        }
                        if (uVar25 < 10000) goto LAB_0018c146;
                        bVar10 = 99999 < uVar25;
                        uVar25 = uVar25 / 10000;
                        cVar16 = cVar37 + '\x04';
                      } while (bVar10);
                      cVar37 = cVar37 + '\x01';
                    }
LAB_0018c146:
                    chunkfiles.
                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)&__str._M_string_length;
                    ppbVar1 = &chunkfiles.
                               super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c164;
                    std::__cxx11::string::_M_construct((ulong)ppbVar1,cVar37);
                    uVar40 = (uint)__str._M_dataplus._M_p;
                    pbVar39 = chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c176;
                    std::__detail::__to_chars_10_impl<unsigned_long>((char *)pbVar39,uVar40,uVar38);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c18f;
                    plVar24 = (long *)std::__cxx11::string::replace
                                                ((ulong)ppbVar1,0,(char *)0x0,0x2260b0);
                    plVar31 = plVar24 + 2;
                    if ((long *)*plVar24 == plVar31) {
                      local_60 = *plVar31;
                      lStack_58 = plVar24[3];
                      __str.field_2._8_8_ = &local_60;
                    }
                    else {
                      local_60 = *plVar31;
                      __str.field_2._8_8_ = (long *)*plVar24;
                    }
                    *plVar24 = (long)plVar31;
                    plVar24[1] = 0;
                    *(undefined1 *)(plVar24 + 2) = 0;
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c1dd;
                    plVar24 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
                    _local_50 = (pointer)&stack0xffffffffffffffc0;
                    psVar32 = (size_type *)(plVar24 + 2);
                    if ((size_type *)*plVar24 == psVar32) {
                      local_40 = *psVar32;
                      uStack_38 = plVar24[3];
                    }
                    else {
                      local_40 = *psVar32;
                      _local_50 = (pointer)*plVar24;
                    }
                    count = plVar24[1];
                    *plVar24 = (long)psVar32;
                    plVar24[1] = 0;
                    *(undefined1 *)(plVar24 + 2) = 0;
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c22f;
                    std::ofstream::ofstream(&local_3d8,(string *)&stack0xffffffffffffffb0,_S_out);
                    _Var15._M_p = _local_50;
                    if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
                      uVar38 = local_40 + 1;
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18c248;
                      operator_delete(_Var15._M_p,uVar38);
                    }
                    uVar14 = __str.field_2._8_8_;
                    if ((long *)__str.field_2._8_8_ != &local_60) {
                      uVar38 = local_60 + 1;
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18c25d;
                      operator_delete((void *)uVar14,uVar38);
                    }
                    pbVar39 = chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    if (chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                        (pointer)&__str._M_string_length) {
                      uVar38 = __str._M_string_length + 1;
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18c279;
                      operator_delete(pbVar39,uVar38);
                    }
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c285;
                    poVar19 = sdglib::OutputLog(INFO,true);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c2ad;
                    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c2c4;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar19," pairs dumping on chunk ",0x18);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c2ec;
                    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                    p_Var6 = poVar19->_vptr_basic_ostream[-3];
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c303;
                    std::ios::widen((char)p_Var6 + (char)poVar19);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c30e;
                    std::ostream::put((char)poVar19);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c316;
                    std::ostream::flush();
                    if ((abStack_3b8[local_3d8[-3]] & 5) != 0) {
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18d882;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Failed to open ",0xf);
                      lVar20 = (long)chunkfiles.
                                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18d8ae;
                      std::__cxx11::to_string
                                ((string *)
                                 &chunkfiles.
                                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (lVar20 >> 3) * 0xfc0fc0fc0fc0fc1);
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18d8c5;
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&__str.field_2 + 8),"sorted_chunk_",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&chunkfiles.
                                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18d8d5;
                      plVar27 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8)
                      ;
                      _local_50 = (pointer)*plVar27;
                      psVar32 = (size_type *)(plVar27 + 2);
                      if ((size_type *)_local_50 == psVar32) {
                        local_40 = *psVar32;
                        uStack_38 = plVar27[3];
                        _local_50 = (pointer)&stack0xffffffffffffffc0;
                      }
                      else {
                        local_40 = *psVar32;
                      }
                      _Var15._M_p = _local_50;
                      uVar33 = plVar27[1];
                      *plVar27 = (long)psVar32;
                      plVar27[1] = 0;
                      *(undefined1 *)(plVar27 + 2) = 0;
                      count = uVar33;
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18dcfd;
                      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cerr,_Var15._M_p,uVar33);
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18dd14;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18dd19;
                      piVar28 = __errno_location();
                      iVar17 = *piVar28;
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18dd20;
                      pcVar29 = strerror(iVar17);
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18dd2b;
                      std::operator<<(poVar19,pcVar29);
                      _Var15._M_p = _local_50;
                      if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
                        uVar38 = local_40 + 1;
                        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                             0x18dd44;
                        operator_delete(_Var15._M_p,uVar38);
                      }
                      uVar11 = __str.field_2._8_8_;
                      if ((long *)__str.field_2._8_8_ != &local_60) {
                        uVar38 = local_60 + 1;
                        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                             0x18dd5d;
                        operator_delete((void *)uVar11,uVar38);
                      }
                      pbVar39 = chunkfiles.
                                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      if (chunkfiles.
                          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                          (pointer)&__str._M_string_length) {
                        *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                             0x18dd79;
                        operator_delete(pbVar39,__str._M_string_length + 1);
                      }
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18dd83;
                      prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
                      lVar20 = (long)chunkfiles.
                                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18ddb2;
                      std::__cxx11::to_string
                                ((string *)auStack_138,(lVar20 >> 3) * 0xfc0fc0fc0fc0fc1);
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18ddcc;
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&chunkfiles.
                                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     "sorted_chunk_",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)auStack_138);
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18dddf;
                      plVar27 = (long *)std::__cxx11::string::append
                                                  ((char *)&chunkfiles.
                                                                                                                        
                                                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                      __str.field_2._8_8_ = *plVar27;
                      plVar24 = plVar27 + 2;
                      if ((long *)__str.field_2._8_8_ == plVar24) {
                        local_60 = *plVar24;
                        lStack_58 = plVar27[3];
                        __str.field_2._8_8_ = &local_60;
                      }
                      else {
                        local_60 = *plVar24;
                      }
                      *plVar27 = (long)plVar24;
                      plVar27[1] = 0;
                      *(undefined1 *)(plVar27 + 2) = 0;
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18e205;
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&stack0xffffffffffffffb0,"Could not open ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&__str.field_2 + 8));
                      *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           0x18e214;
                      std::runtime_error::runtime_error(prVar30,(string *)&stack0xffffffffffffffb0);
                      *(undefined **)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                           &UNK_0018e22d;
                      __cxa_throw(prVar30,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c33b;
                    poVar19 = sdglib::OutputLog(INFO,true);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c363;
                    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c37a;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar19," pairs dumping on chunk ",0x18);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c3a2;
                    poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                    p_Var6 = poVar19->_vptr_basic_ostream[-3];
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c3b9;
                    std::ios::widen((char)p_Var6 + (char)poVar19);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c3c4;
                    std::ostream::put((char)poVar19);
                    *(undefined8 *)((long)&(((pointer)(uVar36 + -0x48))->seq2).field_2 + 8) =
                         0x18c3cc;
                    std::ostream::flush();
                    uVar38 = uStack_c8 * 2 + 0x11 & 0xfffffffffffffff0;
                    pvVar34 = (void *)(uVar36 - uVar38);
                    __range2 = &(readdatav.
                                 super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->tag;
                    currrent_read.seq2.field_2._8_8_ = uVar36;
                    if (auStack_e8 !=
                        (undefined1  [8])
                        readdatav.
                        super__Vector_base<LinkedReadData,_std::allocator<LinkedReadData>_>._M_impl.
                        super__Vector_impl_data._M_start) {
                      readsize_local = uVar36 + (1 - uVar38);
                      auVar35 = auStack_e8;
                      do {
                        *(undefined8 *)((long)pvVar34 + -8) = 0x18c437;
                        std::ostream::write((char *)&local_3d8,(long)auVar35);
                        uVar25 = uStack_c8;
                        lVar21 = uStack_c8 * 2;
                        *(undefined8 *)((long)pvVar34 + -8) = 0x18c453;
                        memset(pvVar34,0,lVar21 + 2);
                        pcVar7 = (((pointer)auVar35)->seq1)._M_dataplus._M_p;
                        uVar38 = (((pointer)auVar35)->seq1)._M_string_length;
                        if (uVar25 <= uVar38) {
                          uVar38 = uVar25;
                        }
                        *(undefined8 *)((long)pvVar34 + -8) = 0x18c46a;
                        memcpy(pvVar34,pcVar7,uVar38);
                        pvVar2 = (void *)(readsize_local + uVar25);
                        pcVar7 = (((pointer)auVar35)->seq2)._M_dataplus._M_p;
                        uVar38 = (((pointer)auVar35)->seq2)._M_string_length;
                        if (uVar38 < uVar25) {
                          uVar25 = uVar38;
                        }
                        *(undefined8 *)((long)pvVar34 + -8) = 0x18c48c;
                        memcpy(pvVar2,pcVar7,uVar25);
                        *(undefined8 *)((long)pvVar34 + -8) = 0x18c49a;
                        std::ostream::write((char *)&local_3d8,(long)pvVar34);
                        auVar35 = (undefined1  [8])((long)auVar35 + 0x48);
                      } while (auVar35 != (undefined1  [8])__range2);
                    }
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c4c5;
                    std::ofstream::close();
                    uVar38 = ((long)chunkfiles.
                                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >>
                             3) * 0xfc0fc0fc0fc0fc1;
                    cVar37 = '\x01';
                    if (9 < uVar38) {
                      uVar25 = uVar38;
                      cVar16 = '\x04';
                      do {
                        cVar37 = cVar16;
                        if (uVar25 < 100) {
                          cVar37 = cVar37 + -2;
                          goto LAB_0018c53f;
                        }
                        if (uVar25 < 1000) {
                          cVar37 = cVar37 + -1;
                          goto LAB_0018c53f;
                        }
                        if (uVar25 < 10000) goto LAB_0018c53f;
                        bVar10 = 99999 < uVar25;
                        uVar25 = uVar25 / 10000;
                        cVar16 = cVar37 + '\x04';
                      } while (bVar10);
                      cVar37 = cVar37 + '\x01';
                    }
LAB_0018c53f:
                    chunkfiles.
                    super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)&__str._M_string_length;
                    ppbVar1 = &chunkfiles.
                               super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c55d;
                    std::__cxx11::string::_M_construct((ulong)ppbVar1,cVar37);
                    uVar40 = (uint)__str._M_dataplus._M_p;
                    pbVar39 = chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c56f;
                    std::__detail::__to_chars_10_impl<unsigned_long>((char *)pbVar39,uVar40,uVar38);
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c588;
                    plVar24 = (long *)std::__cxx11::string::replace
                                                ((ulong)ppbVar1,0,(char *)0x0,0x2260b0);
                    plVar31 = plVar24 + 2;
                    if ((long *)*plVar24 == plVar31) {
                      local_60 = *plVar31;
                      lStack_58 = plVar24[3];
                      __str.field_2._8_8_ = &local_60;
                    }
                    else {
                      local_60 = *plVar31;
                      __str.field_2._8_8_ = (long *)*plVar24;
                    }
                    *plVar24 = (long)plVar31;
                    plVar24[1] = 0;
                    *(undefined1 *)(plVar24 + 2) = 0;
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c5d6;
                    plVar24 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8);
                    _local_50 = (pointer)&stack0xffffffffffffffc0;
                    psVar32 = (size_type *)(plVar24 + 2);
                    if ((size_type *)*plVar24 == psVar32) {
                      local_40 = *psVar32;
                      uStack_38 = plVar24[3];
                    }
                    else {
                      local_40 = *psVar32;
                      _local_50 = (pointer)*plVar24;
                    }
                    count = plVar24[1];
                    *plVar24 = (long)psVar32;
                    plVar24[1] = 0;
                    *(undefined1 *)(plVar24 + 2) = 0;
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c627;
                    std::vector<std::ifstream,std::allocator<std::ifstream>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::ifstream,std::allocator<std::ifstream>> *)auStack_a8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xffffffffffffffb0);
                    _Var15._M_p = _local_50;
                    if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
                      uVar38 = local_40 + 1;
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18c640;
                      operator_delete(_Var15._M_p,uVar38);
                    }
                    uVar36 = __str.field_2._8_8_;
                    if ((long *)__str.field_2._8_8_ != &local_60) {
                      uVar38 = local_60 + 1;
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18c655;
                      operator_delete((void *)uVar36,uVar38);
                    }
                    pbVar39 = chunkfiles.
                              super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    if (chunkfiles.
                        super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                        (pointer)&__str._M_string_length) {
                      uVar38 = __str._M_string_length + 1;
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18c671;
                      operator_delete(pbVar39,uVar38);
                    }
                    auVar35 = auStack_e8;
                    if (((byte)chunkfiles.
                               super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [*(long *)(*(long *)(chunkfiles.
                                                                                                        
                                                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + -0x208
                                                  ) + -0x18) + -0x1e8] & 5) != 0) {
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18d917;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"Failed to open ",0xf);
                      lVar20 = (long)chunkfiles.
                                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18d943;
                      std::__cxx11::to_string
                                ((string *)
                                 &chunkfiles.
                                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (lVar20 >> 3) * 0xfc0fc0fc0fc0fc1);
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18d95a;
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&__str.field_2 + 8),"sorted_chunk_",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&chunkfiles.
                                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18d96a;
                      plVar27 = (long *)std::__cxx11::string::append(__str.field_2._M_local_buf + 8)
                      ;
                      _local_50 = (pointer)*plVar27;
                      psVar32 = (size_type *)(plVar27 + 2);
                      if ((size_type *)_local_50 == psVar32) {
                        local_40 = *psVar32;
                        uStack_38 = plVar27[3];
                        _local_50 = (pointer)&stack0xffffffffffffffc0;
                      }
                      else {
                        local_40 = *psVar32;
                      }
                      _Var15._M_p = _local_50;
                      uVar33 = plVar27[1];
                      *plVar27 = (long)psVar32;
                      plVar27[1] = 0;
                      *(undefined1 *)(plVar27 + 2) = 0;
                      count = uVar33;
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18de3f;
                      poVar19 = std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cerr,_Var15._M_p,uVar33);
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18de56;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar19,": ",2);
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18de5b;
                      piVar28 = __errno_location();
                      iVar17 = *piVar28;
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18de62;
                      pcVar29 = strerror(iVar17);
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18de6d;
                      std::operator<<(poVar19,pcVar29);
                      _Var15._M_p = _local_50;
                      if (_local_50 != (pointer)&stack0xffffffffffffffc0) {
                        uVar38 = local_40 + 1;
                        *(undefined8 *)((long)pvVar34 + -8) = 0x18de86;
                        operator_delete(_Var15._M_p,uVar38);
                      }
                      uVar36 = __str.field_2._8_8_;
                      if ((long *)__str.field_2._8_8_ != &local_60) {
                        uVar38 = local_60 + 1;
                        *(undefined8 *)((long)pvVar34 + -8) = 0x18de9f;
                        operator_delete((void *)uVar36,uVar38);
                      }
                      pbVar39 = chunkfiles.
                                super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                      if (chunkfiles.
                          super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                          (pointer)&__str._M_string_length) {
                        *(undefined8 *)((long)pvVar34 + -8) = 0x18debb;
                        operator_delete(pbVar39,__str._M_string_length + 1);
                      }
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18dec5;
                      prVar30 = (runtime_error *)__cxa_allocate_exception(0x10);
                      lVar20 = (long)chunkfiles.
                                     super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_a8;
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18def4;
                      std::__cxx11::to_string
                                ((string *)auStack_138,(lVar20 >> 3) * 0xfc0fc0fc0fc0fc1);
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18df0e;
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&chunkfiles.
                                         super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     "sorted_chunk_",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)auStack_138);
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18df21;
                      plVar27 = (long *)std::__cxx11::string::append
                                                  ((char *)&chunkfiles.
                                                                                                                        
                                                  super__Vector_base<std::basic_ifstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  );
                      __str.field_2._8_8_ = *plVar27;
                      plVar24 = plVar27 + 2;
                      if ((long *)__str.field_2._8_8_ == plVar24) {
                        local_60 = *plVar24;
                        lStack_58 = plVar27[3];
                        __str.field_2._8_8_ = &local_60;
                      }
                      else {
                        local_60 = *plVar24;
                      }
                      *plVar27 = (long)plVar24;
                      plVar27[1] = 0;
                      *(undefined1 *)(plVar27 + 2) = 0;
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18e268;
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&stack0xffffffffffffffb0,"Could not open ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&__str.field_2 + 8));
                      *(undefined8 *)((long)pvVar34 + -8) = 0x18e277;
                      std::runtime_error::runtime_error(prVar30,(string *)&stack0xffffffffffffffb0);
                      *(undefined **)((long)pvVar34 + -8) = &UNK_0018e290;
                      __cxa_throw(prVar30,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c6a4;
                    std::vector<LinkedReadData,_std::allocator<LinkedReadData>_>::_M_erase_at_end
                              ((vector<LinkedReadData,_std::allocator<LinkedReadData>_> *)auStack_e8
                               ,(pointer)auVar35);
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c6b0;
                    poVar19 = sdglib::OutputLog(INFO,true);
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c6c7;
                    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"dumped!",7);
                    p_Var6 = poVar19->_vptr_basic_ostream[-3];
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c6db;
                    std::ios::widen((char)p_Var6 + (char)poVar19);
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c6e6;
                    std::ostream::put((char)poVar19);
                    *(undefined8 *)((long)pvVar34 + -8) = 0x18c6ee;
                    std::ostream::flush();
                    uVar36 = currrent_read.seq2.field_2._8_8_;
                    local_3d8 = plVar27;
                    *(undefined8 *)((long)&local_3d8 + plVar27[-3]) = uVar11;
                    *(undefined8 *)(uVar36 + -8) = 0x18c722;
                    std::filebuf::~filebuf((filebuf *)&output);
                    *(undefined8 *)(uVar36 + -8) = 0x18c72e;
                    std::ios_base::~ios_base(local_2e0);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0018bb3b;
}

Assistant:

void LinkedReadsDatastore::build_from_fastq(std::string output_filename, std::string default_name, std::string read1_filename,
                                            std::string read2_filename,
                                            LinkedReadsFormat format, uint64_t readsize, size_t chunksize) {
    std::vector<uint32_t> read_tag;
    //std::cout<<"Memory used by every read's entry:"<< sizeof(LinkedRead)<<std::endl;
    //read each read, put it on the index and on the appropriate tag
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Creating Datastore Index from "<<read1_filename<<" | "<<read2_filename<<std::endl;
    auto fd1=gzopen(read1_filename.c_str(),"r");
    if (!fd1) {
        std::cerr << "Failed to open " << read1_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + read1_filename);
    }
    auto fd2=gzopen(read2_filename.c_str(),"r");

    if (!fd2) {
        std::cerr << "Failed to open " << read2_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + read2_filename);
    }
    char readbuffer[1000];
    uint64_t r1offset,r2offset;
    uint64_t tagged_reads=0;
    //first, build an index of tags and offsets
    sdglib::OutputLog()<<"Building tag sorted chunks of "<<chunksize<<" pairs"<<std::endl;
    std::vector<LinkedReadData> readdatav;
    readdatav.reserve(chunksize);
    std::vector<std::ifstream> chunkfiles;
    std::vector<LinkedReadData> next_in_chunk;
    LinkedReadData currrent_read;
    //First, create the chunk files
    uint64_t pairs=0;
    while (!gzeof(fd1) and !gzeof(fd2)) {
        LinkedTag newtag = 0;
        if (format==LinkedReadsFormat::UCDavis) {
            //LinkedRead r1,r2;
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be missing a header");
            }
            //Tag to number from r1's name
            for (auto i = 1; i < 17; ++i) {
                newtag <<= 2;
                if (readbuffer[i] == 'C') newtag += 1;
                else if (readbuffer[i] == 'G') newtag += 2;
                else if (readbuffer[i] == 'T') newtag += 3;
                else if (readbuffer[i] != 'A') {
                    newtag = 0;
                    break;
                }
            }
            currrent_read.tag=newtag;
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            currrent_read.seq1=std::string(readbuffer);
            if (currrent_read.seq1.back()=='\n') currrent_read.seq1.resize(currrent_read.seq1.size()-1);
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;

            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            currrent_read.seq2=std::string(readbuffer);
            if (currrent_read.seq2.back()=='\n') currrent_read.seq2.resize(currrent_read.seq2.size()-1);
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
        }
        else if (format==LinkedReadsFormat::raw){
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            for (auto i = 0; i < 16; ++i) {
                newtag <<= 2;
                if (readbuffer[i] == 'C') newtag += 1;
                else if (readbuffer[i] == 'G') newtag += 2;
                else if (readbuffer[i] == 'T') newtag += 3;
                else if (readbuffer[i] != 'A') {
                    newtag = 0;
                    break;
                }
            }
            currrent_read.tag=newtag;
            currrent_read.seq1=std::string(readbuffer + 16 + 7);
            if (currrent_read.seq1.back()=='\n') currrent_read.seq1.resize(currrent_read.seq1.size()-1);
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read1_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd1, readbuffer, 999)) continue;

            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '@') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be missing a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            currrent_read.seq2=std::string(readbuffer);
            if (currrent_read.seq2.back()=='\n') currrent_read.seq2.resize(currrent_read.seq2.size()-1);
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
            if(!readbuffer[0] == '+') {
                throw std::runtime_error("Please check: " + read2_filename + ", it seems to be desynchronised a header");
            }
            if (NULL == gzgets(fd2, readbuffer, 999)) continue;
        }
        if (0 != newtag) tagged_reads += 2;
        ++pairs;
        readdatav.push_back(currrent_read);
        if (readdatav.size()==chunksize){
            //sort
            std::sort(readdatav.begin(),readdatav.end());
            //dump
            std::ofstream ofile("sorted_chunk_"+std::to_string(chunkfiles.size())+".data");
            sdglib::OutputLog()<<readdatav.size()<<" pairs dumping on chunk "<<chunkfiles.size()<<std::endl;
            if (!ofile) {
                std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
                throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") );

            }

            sdglib::OutputLog()<<readdatav.size()<<" pairs dumping on chunk "<<chunkfiles.size()<<std::endl;
            //add file to vector of files
            char buffer[2*readsize+2];
            for (auto &r:readdatav){
                ofile.write((const char * ) &r.tag,sizeof(r.tag));
                bzero(buffer,2*readsize+2);
                memcpy(buffer,r.seq1.data(),(r.seq1.size()>readsize ? readsize : r.seq1.size()));
                memcpy(buffer+readsize+1,r.seq2.data(),(r.seq2.size()>readsize ? readsize : r.seq2.size()));
                ofile.write(buffer,2*readsize+2);
            }
            ofile.close();
            chunkfiles.emplace_back("sorted_chunk_"+std::to_string(chunkfiles.size())+".data");
            if (!chunkfiles.back()) {
                std::cerr << "Failed to open " << ("sorted_chunk_"+std::to_string(chunkfiles.size())+".data") <<": " << strerror(errno);
                throw std::runtime_error("Could not open " + ("sorted_chunk_"+std::to_string(chunkfiles.size())+".data") );
            }
            readdatav.clear();
            sdglib::OutputLog()<<"dumped!"<<std::endl;
        }
    }
    if (readdatav.size()>0) {
        //sort
        std::sort(readdatav.begin(), readdatav.end());
        //dump
        std::ofstream ofile("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data");
        sdglib::OutputLog() << readdatav.size() << " pairs dumping on chunk " << chunkfiles.size() << std::endl;
        if (!ofile) {
            std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
            throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") );

        }
        sdglib::OutputLog() << readdatav.size() << " pairs dumping on chunk " << chunkfiles.size() << std::endl;
        //add file to vector of files
        char buffer[2 * readsize + 2];
        for (auto &r:readdatav) {
            ofile.write((const char *) &r.tag, sizeof(r.tag));
            bzero(buffer, 2 * readsize + 2);
            memcpy(buffer, r.seq1.data(), (r.seq1.size() > readsize ? readsize : r.seq1.size()));
            memcpy(buffer + readsize + 1, r.seq2.data(), (r.seq2.size() > readsize ? readsize : r.seq2.size()));
            ofile.write(buffer, 2 * readsize + 2);
        }
        ofile.close();
        chunkfiles.emplace_back("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data");
        if (!chunkfiles.back()) {
            std::cerr << "Failed to open " << ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data") <<": " << strerror(errno);
            throw std::runtime_error("Could not open " + ("sorted_chunk_" + std::to_string(chunkfiles.size()) + ".data"));
        }
        readdatav.clear();
        sdglib::OutputLog() << "dumped!" << std::endl;
    }
    sdglib::OutputLog() << "performing merge from disk" << std::endl;
    //TODO: save space first for the tag index!!!
    std::ofstream output(output_filename.c_str());
    if (!output) {
        std::cerr << "Failed to open " << output_filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + output_filename);
    }

    output.write((const char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    output.write((const char *) &SDG_VN, sizeof(SDG_VN));
    SDG_FILETYPE type(LinkedDS_FT);
    output.write((char *) &type, sizeof(type));

    sdglib::write_string(output, default_name);

    output.write((const char *) &readsize,sizeof(readsize));
    read_tag.resize(pairs);
    sdglib::OutputLog() << "leaving space for " <<pairs<<" read_tag entries"<< std::endl;

    sdglib::write_flat_vector(output,read_tag);

    //multi_way merge of the chunks
    int openfiles=chunkfiles.size();
    LinkedTag next_tags[chunkfiles.size()];
    char buffer[2 * readsize + 2];
    //read a bit from each file
    for (auto i=0;i<chunkfiles.size();++i) chunkfiles[i].read((char *)&next_tags[i],sizeof(LinkedTag));
    read_tag.clear();
    while(openfiles){
        LinkedTag mintag=UINT32_MAX;
        //find the minimum tag
        for (auto &t:next_tags) if (t<mintag) mintag=t;
        //copy from each file till the next tag is > than minimum
        for (auto i=0;i<chunkfiles.size();++i){
            while (!chunkfiles[i].eof() and next_tags[i]==mintag){
                //read buffer from file and write to final file
                chunkfiles[i].read(buffer,2*readsize+2);
                output.write(buffer,2*readsize+2);
                read_tag.push_back(mintag);
                //read next tag... eof? tag=UINT32_MAX
                chunkfiles[i].read((char *)&next_tags[i],sizeof(LinkedTag));
                if (chunkfiles[i].eof()) {
                    --openfiles;
                    next_tags[i]=UINT32_MAX;
                    sdglib::OutputLog() << "chunk "<<i<<" finished"<<std::endl;
                }
            }
        }
    }

    // Write empty mapper data
    output.write((char *) &SDG_MAGIC, sizeof(SDG_MAGIC));
    output.write((char *) &SDG_VN, sizeof(SDG_VN));
    type = PairedMap_FT;
    output.write((char *) &type, sizeof(type));

    std::vector<sgNodeID_t> read_to_node;
    sdglib::write_flat_vector(output, read_to_node);
    std::vector<std::vector<ReadMapping>> reads_in_node;
    sdglib::write_flat_vectorvector(output, reads_in_node);

    // Done

    //go back to the beginning of the file and write the read_tag part again
    output.seekp(sizeof(SDG_MAGIC)+sizeof(SDG_VN)+sizeof(type)+sizeof(readsize)+sizeof(uint64_t)+(default_name.size()*sizeof(char)));
    sdglib::OutputLog() << "writing down " <<pairs<<" read_tag entries"<< std::endl;
    sdglib::write_flat_vector(output, read_tag);

    output.close();
    //delete all temporary chunk files
    for (auto &c:chunkfiles) c.close();
    for (auto i=0;i<chunkfiles.size();++i) ::unlink(("sorted_chunk_"+std::to_string(i)+".data").c_str());
    //DONE!
    sdglib::OutputLog(sdglib::LogLevels::INFO)<<"Datastore with "<<(read_tag.size())*2<<" reads, "<<tagged_reads<<" reads with tags"<<std::endl; //and "<<reads_in_tag.size()<<"tags"<<std::endl;
    gzclose(fd1);
    gzclose(fd2);
}